

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::Map(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
      *this,Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
            *other)

{
  const_iterator first;
  const_iterator last;
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  local_68;
  Node *local_50;
  InnerMap *pIStack_48;
  size_type local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  this->arena_ = (Arena *)0x0;
  this->default_enum_value_ = other->default_enum_value_;
  Init(this);
  local_68.m_ = other->elements_;
  InnerMap::
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  ::SearchFrom(&local_68,(local_68.m_)->index_of_first_non_null_);
  local_50 = local_68.node_;
  pIStack_48 = local_68.m_;
  local_40 = local_68.bucket_index_;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  first.it_.m_ = local_68.m_;
  first.it_.node_ = local_68.node_;
  first.it_.bucket_index_ = local_68.bucket_index_;
  last.it_.bucket_index_ = 0;
  last.it_.node_ = (Node *)0x0;
  last.it_.m_ = (InnerMap *)0x0;
  Map<std::__cxx11::string,google::protobuf::Value>::
  insert<google::protobuf::Map<std::__cxx11::string,google::protobuf::Value>::const_iterator>
            ((Map<std::__cxx11::string,google::protobuf::Value> *)this,first,last);
  return;
}

Assistant:

Map(const Map& other)
      : arena_(nullptr), default_enum_value_(other.default_enum_value_) {
    Init();
    insert(other.begin(), other.end());
  }